

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

bool __thiscall TiXmlDocument::SaveFile(TiXmlDocument *this,FILE *fp)

{
  int iVar1;
  
  if (this->useMicrosoftBOM == true) {
    fputc(0xef,(FILE *)fp);
    fputc(0xbb,(FILE *)fp);
    fputc(0xbf,(FILE *)fp);
  }
  (*(this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase[2])(this,fp,0);
  iVar1 = ferror((FILE *)fp);
  return iVar1 == 0;
}

Assistant:

bool TiXmlDocument::SaveFile( FILE* fp ) const
{
	if ( useMicrosoftBOM ) 
	{
		const unsigned char TIXML_UTF_LEAD_0 = 0xefU;
		const unsigned char TIXML_UTF_LEAD_1 = 0xbbU;
		const unsigned char TIXML_UTF_LEAD_2 = 0xbfU;

		fputc( TIXML_UTF_LEAD_0, fp );
		fputc( TIXML_UTF_LEAD_1, fp );
		fputc( TIXML_UTF_LEAD_2, fp );
	}
	Print( fp, 0 );
	return (ferror(fp) == 0);
}